

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

void __thiscall xe::ri::EglConfigSet::~EglConfigSet(EglConfigSet *this)

{
  ~EglConfigSet(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

~EglConfigSet		(void) {}